

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O1

void __thiscall UEFITool::readSettings(UEFITool *this)

{
  undefined8 uVar1;
  PrivateShared *pPVar2;
  QArrayData *pQVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QSettings settings;
  QList<int> horList;
  QString fontName;
  QList<int> vertList;
  QArrayData *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  anon_union_24_3_e3d07ef4_for_data local_118;
  undefined8 local_100;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  undefined1 local_d8 [24];
  undefined8 uStack_c0;
  qsizetype local_b8;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  QPodArrayOps<int> local_88;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QSettings::QSettings((QSettings *)local_d8,(QObject *)this);
  QVar8.m_data = (storage_type *)0x13;
  QVar8.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar8);
  local_d8._16_8_ = local_118.shared;
  uStack_c0 = local_118._8_8_;
  local_b8 = local_118._16_8_;
  local_118.shared = (PrivateShared *)0x0;
  local_118._8_8_ = 0;
  local_118._16_8_ = 0;
  local_100 = 2;
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toByteArray();
  QWidget::restoreGeometry((QByteArray *)this);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_d8._16_8_ = *(int *)local_d8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._16_8_,2,8);
    }
  }
  QVar9.m_data = (storage_type *)0x16;
  QVar9.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar9);
  local_d8._16_8_ = local_118.shared;
  uStack_c0 = local_118._8_8_;
  local_b8 = local_118._16_8_;
  local_118.shared = (PrivateShared *)0x0;
  local_118._8_8_ = 0;
  local_118._16_8_ = 0;
  local_100 = 2;
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toByteArray();
  QMainWindow::restoreState((QByteArray *)this,(int)&local_138);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_d8._16_8_ = *(int *)local_d8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._16_8_,2,8);
    }
  }
  local_b8 = 0;
  local_d8._16_8_ = (QArrayData *)0x0;
  uStack_c0 = 0;
  local_88.super_QArrayDataPointer<int>.size = 0;
  local_88.super_QArrayDataPointer<int>.d = (Data *)0x0;
  local_88.super_QArrayDataPointer<int>.ptr = (int *)0x0;
  QVar10.m_data = (storage_type *)0x14;
  QVar10.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar10);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,600);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  uVar6 = QVariant::toInt((bool *)local_f8.data);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,uVar6);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)(local_d8 + 0x10),local_b8,(int *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QVar11.m_data = (storage_type *)0x14;
  QVar11.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar11);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,0xb4);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  uVar6 = QVariant::toInt((bool *)local_f8.data);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,uVar6);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)(local_d8 + 0x10),local_b8,(int *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QVar12.m_data = (storage_type *)0x15;
  QVar12.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar12);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,400);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  uVar6 = QVariant::toInt((bool *)local_f8.data);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,uVar6);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            (&local_88,local_88.super_QArrayDataPointer<int>.size,(int *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QVar13.m_data = (storage_type *)0x18;
  QVar13.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar13);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,0xb4);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  uVar6 = QVariant::toInt((bool *)local_f8.data);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,uVar6);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            (&local_88,local_88.super_QArrayDataPointer<int>.size,(int *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QSplitter::setSizes(*(QList **)(this->ui + 0x118));
  QSplitter::setSizes(*(QList **)(this->ui + 0x110));
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar14.m_data = (storage_type *)0x11;
  QVar14.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar14);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  iVar7 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_118,iVar7);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar1,0);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar15.m_data = (storage_type *)0x11;
  QVar15.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar15);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  iVar7 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_118,iVar7);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar1,1);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar16.m_data = (storage_type *)0x11;
  QVar16.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar16);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  iVar7 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_118,iVar7);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar1,2);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar17.m_data = (storage_type *)0x11;
  QVar17.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar17);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  iVar7 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_118,iVar7);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar1,3);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QVar18.m_data = (storage_type *)0x13;
  QVar18.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar18);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,true);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  bVar5 = (bool)QVariant::toBool();
  this->markingEnabled = bVar5;
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QAction::setChecked(SUB81(*(undefined8 *)(this->ui + 0xd8),0));
  local_a8 = (QArrayData *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  QVar19.m_data = (storage_type *)0x13;
  QVar19.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar19);
  local_68 = (QArrayData *)local_118.shared;
  uStack_60 = local_118._8_8_;
  local_58 = local_118._16_8_;
  QVar20.m_data = (storage_type *)0xb;
  QVar20.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar20);
  local_38 = local_138;
  uStack_30 = uStack_130;
  local_28 = local_128;
  QVariant::QVariant((QVariant *)&local_118,(QString *)&local_38);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  QVariant::toString();
  uVar4 = local_98;
  uVar1 = uStack_a0;
  pQVar3 = local_a8;
  local_a8 = local_50;
  local_50 = pQVar3;
  uStack_a0 = local_48;
  local_98 = uStack_40;
  local_48 = uVar1;
  uStack_40 = uVar4;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QVar21.m_data = (storage_type *)0x13;
  QVar21.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar21);
  local_138 = (QArrayData *)local_118.shared;
  uStack_130 = local_118._8_8_;
  local_128 = local_118._16_8_;
  QVariant::QVariant((QVariant *)&local_118,10);
  QSettings::value((QString *)local_f8.data,(QVariant *)local_d8);
  iVar7 = QVariant::toInt((bool *)local_f8.data);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_118);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,8);
    }
  }
  QFont::QFont((QFont *)local_f8.data,(QString *)&local_a8,iVar7,-1,false);
  pPVar2 = *(PrivateShared **)&this->currentFont;
  *(PrivateShared **)&this->currentFont = local_f8.shared;
  uVar6 = *(undefined4 *)&this->field_0xd8;
  *(undefined4 *)&this->field_0xd8 = local_f8._8_4_;
  local_f8.shared = pPVar2;
  local_f8._8_4_ = uVar6;
  QFont::~QFont((QFont *)local_f8.data);
  QFont::setStyleHint(&this->currentFont,7,1);
  QApplication::setFont(&this->currentFont,(char *)0x0);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,8);
    }
  }
  if (&(local_88.super_QArrayDataPointer<int>.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_88.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.super_QArrayDataPointer<int>.d)->super_QArrayData,4,8);
    }
  }
  if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_d8._16_8_ = *(int *)local_d8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._16_8_,4,8);
    }
  }
  QSettings::~QSettings((QSettings *)local_d8);
  return;
}

Assistant:

void UEFITool::readSettings()
{
    QSettings settings(this);
    restoreGeometry(settings.value("mainWindow/geometry").toByteArray());
    restoreState(settings.value("mainWindow/windowState").toByteArray());
    QList<int> horList, vertList;
    horList.append(settings.value("mainWindow/treeWidth", 600).toInt());
    horList.append(settings.value("mainWindow/infoWidth", 180).toInt());
    vertList.append(settings.value("mainWindow/treeHeight", 400).toInt());
    vertList.append(settings.value("mainWindow/messageHeight", 180).toInt());
    ui->infoSplitter->setSizes(horList);
    ui->messagesSplitter->setSizes(vertList);
    ui->structureTreeView->setColumnWidth(0, settings.value("tree/columnWidth0", ui->structureTreeView->columnWidth(0)).toInt());
    ui->structureTreeView->setColumnWidth(1, settings.value("tree/columnWidth1", ui->structureTreeView->columnWidth(1)).toInt());
    ui->structureTreeView->setColumnWidth(2, settings.value("tree/columnWidth2", ui->structureTreeView->columnWidth(2)).toInt());
    ui->structureTreeView->setColumnWidth(3, settings.value("tree/columnWidth3", ui->structureTreeView->columnWidth(3)).toInt());
    markingEnabled = settings.value("tree/markingEnabled", true).toBool();
    ui->actionToggleBootGuardMarking->setChecked(markingEnabled);
    
    // Set monospace font
    QString fontName;
    int fontSize;
#if defined Q_OS_MACOS
    fontName = settings.value("mainWindow/fontName", QString("Menlo")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#elif defined Q_OS_WIN
    fontName = settings.value("mainWindow/fontName", QString("Consolas")).toString();
    fontSize = settings.value("mainWindow/fontSize", 9).toInt();
#else
    fontName = settings.value("mainWindow/fontName", QString("Courier New")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#endif
    currentFont = QFont(fontName, fontSize);
    currentFont.setStyleHint(QFont::Monospace);
    QApplication::setFont(currentFont);
}